

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

bool __thiscall despot::util::tinyxml::TiXmlPrinter::Visit(TiXmlPrinter *this,TiXmlComment *comment)

{
  char *suffix;
  TiXmlComment *comment_local;
  TiXmlPrinter *this_local;
  
  DoIndent(this);
  TiXmlString::operator+=(&this->buffer,"<!--");
  suffix = TiXmlNode::Value(&comment->super_TiXmlNode);
  TiXmlString::operator+=(&this->buffer,suffix);
  TiXmlString::operator+=(&this->buffer,"-->");
  DoLineBreak(this);
  return true;
}

Assistant:

bool TiXmlPrinter::Visit(const TiXmlComment& comment) {
	DoIndent();
	buffer += "<!--";
	buffer += comment.Value();
	buffer += "-->";
	DoLineBreak();
	return true;
}